

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void QSslSocketPrivate::addDefaultCaCertificate(QSslCertificate *cert)

{
  bool bVar1;
  Type *pTVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *pQVar3;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *this;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)local_28
  ;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)cert;
  ensureInitialized();
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(pQVar3);
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&pTVar2->mutex);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()(this);
  pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
           &((pTVar2->config).d.ptr)->caCertificates;
  bVar1 = QListSpecialMethodsBase<QSslCertificate>::contains<QSslCertificate>
                    ((QListSpecialMethodsBase<QSslCertificate> *)pQVar3,cert);
  if (!bVar1) {
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar3);
    pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             &pTVar2->config;
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pQVar3);
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar3);
    pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             &((pTVar2->config).d.ptr)->caCertificates;
    QList<QSslCertificate>::emplaceBack<QSslCertificate_const&>
              ((QList<QSslCertificate> *)pQVar3,cert);
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar3);
    pQVar3 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             &pTVar2->dtlsConfig;
    QExplicitlySharedDataPointer<QSslConfigurationPrivate>::detach
              ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)pQVar3);
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
             operator()(pQVar3);
    QList<QSslCertificate>::emplaceBack<QSslCertificate_const&>
              (&((pTVar2->dtlsConfig).d.ptr)->caCertificates,cert);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::addDefaultCaCertificate(const QSslCertificate &cert)
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    if (globalData()->config->caCertificates.contains(cert))
        return;
    globalData()->config.detach();
    globalData()->config->caCertificates += cert;
    globalData()->dtlsConfig.detach();
    globalData()->dtlsConfig->caCertificates += cert;
}